

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

Error __thiscall wave::File::Impl::WriteHeader(Impl *this,uint64_t data_size)

{
  ofstream *poVar1;
  char cVar2;
  Error EVar3;
  long lVar4;
  ushort uVar5;
  uint32_t uVar6;
  undefined1 auVar7 [16];
  
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    EVar3 = kNotOpen;
  }
  else {
    poVar1 = &this->ostream;
    auVar7 = std::ostream::tellp();
    std::ostream::seekp(poVar1,0,0);
    uVar5 = (this->header).fmt.bits_per_sample >> 3;
    uVar6 = (int)data_size * (uint)uVar5;
    (this->header).riff.chunk_size = uVar6 + 0x24;
    uVar5 = (this->header).fmt.num_channel * uVar5;
    (this->header).fmt.byte_per_block = uVar5;
    (this->header).fmt.byte_rate = (uint)uVar5 * (this->header).fmt.sample_rate;
    (this->header).data.sub_chunk_2_size = uVar6;
    std::ostream::write((char *)poVar1,(long)&this->header);
    if (((&this->field_0x228)[*(long *)(*(long *)&this->ostream + -0x18)] & 5) == 0) {
      lVar4 = std::ostream::tellp();
      if (lVar4 < auVar7._0_8_) {
        std::ostream::seekp(poVar1,auVar7._0_8_,auVar7._8_8_);
      }
      this->data_offset_ = 0x2c;
      EVar3 = kNoError;
    }
    else {
      EVar3 = kWriteError;
    }
  }
  return EVar3;
}

Assistant:

Error WriteHeader(uint64_t data_size) {
    if (!ostream.is_open()) {
      return kNotOpen;
    }
    auto original_position = ostream.tellp();
    // Position to beginning of file
    ostream.seekp(0);

    // make header
    auto bits_per_sample = header.fmt.bits_per_sample;
    auto bytes_per_sample = bits_per_sample / 8;
    auto channel_number = header.fmt.num_channel;
    auto sample_rate = header.fmt.sample_rate;

    header.riff.chunk_size =
        sizeof(WAVEHeader) + (data_size * (bits_per_sample / 8)) - 8;
    // fmt header
    header.fmt.byte_per_block = bytes_per_sample * channel_number;
    header.fmt.byte_rate = sample_rate * header.fmt.byte_per_block;
    // data header
    header.data.sub_chunk_2_size = data_size * bytes_per_sample;

    ostream.write(reinterpret_cast<char*>(&header), sizeof(WAVEHeader));
    if (ostream.fail()) {
      return kWriteError;
    }

    // reposition to old position if was > to current position
    if (ostream.tellp() < original_position) {
      ostream.seekp(original_position);
    }

    // the offset of data will be right after the headers
    data_offset_ = sizeof(WAVEHeader);
    return kNoError;
  }